

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O2

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance
          (ModelBaseEKFFlexEstimatorIMU *this,double d)

{
  ExtendedKalmanFilter *this_00;
  double *__ptr;
  Index IVar1;
  Index IVar2;
  DiagonalReturnType local_70;
  Pmatrix local_60 [2];
  
  this->unmodeledForceVariance_ = d;
  if (0.0 < d) {
    setWithUnmodeledForces(this,true);
  }
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  KalmanFilterBase::getStateCovariance(local_60,&this_00->super_KalmanFilterBase);
  __ptr = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_60[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
  ;
  IVar1 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  IVar2 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_60[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
  ;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_60[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
  ;
  local_60[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       __ptr;
  local_60[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       IVar1;
  local_60[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       IVar2;
  free(__ptr);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::diagonal
            (&local_70,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->P_);
  Eigen::VectorBlock<Eigen::Diagonal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_6>::VectorBlock
            ((VectorBlock<Eigen::Diagonal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_6> *)
             local_60,&local_70,0x18,6);
  Eigen::
  DenseBase<Eigen::Block<Eigen::Diagonal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_6,_1,_false>_>
  ::setConstant((DenseBase<Eigen::Block<Eigen::Diagonal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_6,_1,_false>_>
                 *)local_60,&this->unmodeledForceVariance_);
  KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,&this->P_);
  return;
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance(double d)
{
  unmodeledForceVariance_ = d;
  if(d > 0)
  {
    setWithUnmodeledForces(true);
  }
  P_ = ekf_.getStateCovariance();
  P_.diagonal().segment<6>(state::unmodeledForces).setConstant(unmodeledForceVariance_);
  ekf_.setStateCovariance(P_);
}